

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O3

void tr_partition(saidx_t *ISAd,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t **pa,
                 saidx_t **pb,saidx_t v)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  
  do {
    piVar4 = middle;
    piVar10 = piVar4;
    if (last <= piVar4) goto LAB_00105f4f;
    middle = piVar4 + 1;
  } while (ISAd[*piVar4] == v);
  piVar6 = piVar4 + 1;
  if (ISAd[*piVar4] < v) {
    while (piVar4 = piVar6, piVar4 < last) {
      iVar1 = *piVar4;
      if (v < ISAd[iVar1]) break;
      if (ISAd[iVar1] == v) {
        *piVar4 = *piVar10;
        *piVar10 = iVar1;
        piVar10 = piVar10 + 1;
      }
      piVar6 = piVar4 + 1;
    }
  }
LAB_00105f4f:
  piVar6 = last + -1;
  do {
    piVar3 = piVar6;
    piVar7 = piVar3;
    if (piVar3 <= piVar4) goto LAB_00105fe6;
    piVar6 = piVar3 + -1;
  } while (ISAd[*piVar3] == v);
  if (v < ISAd[*piVar3]) {
    for (; piVar7 = piVar6, piVar4 < piVar6; piVar6 = piVar6 + -1) {
      iVar1 = *piVar6;
      if (ISAd[iVar1] < v) break;
      if (ISAd[iVar1] == v) {
        *piVar6 = *piVar3;
        *piVar3 = iVar1;
        piVar3 = piVar3 + -1;
      }
    }
  }
LAB_00105fe6:
  do {
    if (piVar7 <= piVar4) {
      if (piVar10 <= piVar3) {
        uVar5 = (uint)((ulong)((long)piVar10 - (long)first) >> 2);
        uVar9 = (uint)((ulong)((long)piVar4 - (long)piVar10) >> 2);
        if ((int)uVar5 < (int)uVar9) {
          uVar9 = uVar5;
        }
        if (0 < (int)uVar9) {
          uVar5 = uVar9 + 1;
          lVar11 = 0;
          do {
            uVar2 = *(undefined4 *)((long)first + lVar11);
            *(undefined4 *)((long)first + lVar11) =
                 *(undefined4 *)((long)piVar4 + lVar11 + (ulong)uVar9 * -4);
            *(undefined4 *)((long)piVar4 + lVar11 + (ulong)uVar9 * -4) = uVar2;
            uVar5 = uVar5 - 1;
            lVar11 = lVar11 + 4;
          } while (1 < uVar5);
        }
        lVar11 = (long)piVar3 - (long)(piVar4 + -1) >> 2;
        uVar9 = (int)((ulong)((long)last - (long)piVar3) >> 2) - 1;
        uVar5 = (uint)lVar11;
        if ((int)uVar5 <= (int)uVar9) {
          uVar9 = uVar5;
        }
        if (0 < (int)uVar9) {
          uVar5 = uVar9 + 1;
          lVar8 = 0;
          do {
            uVar2 = *(undefined4 *)((long)piVar4 + lVar8);
            *(undefined4 *)((long)piVar4 + lVar8) =
                 *(undefined4 *)((long)last + lVar8 + (ulong)uVar9 * -4);
            *(undefined4 *)((long)last + lVar8 + (ulong)uVar9 * -4) = uVar2;
            uVar5 = uVar5 - 1;
            lVar8 = lVar8 + 4;
          } while (1 < uVar5);
        }
        first = (saidx_t *)((long)first + ((long)piVar4 - (long)piVar10));
        last = last + -lVar11;
      }
      *pa = first;
      *pb = last;
      return;
    }
    iVar1 = *piVar4;
    *piVar4 = *piVar7;
    *piVar7 = iVar1;
    while (piVar4 = piVar4 + 1, piVar4 < piVar7) {
      iVar1 = *piVar4;
      if (v < ISAd[iVar1]) break;
      if (ISAd[iVar1] == v) {
        *piVar4 = *piVar10;
        *piVar10 = iVar1;
        piVar10 = piVar10 + 1;
      }
    }
LAB_00105fd4:
    piVar7 = piVar7 + -1;
  } while (piVar7 <= piVar4);
  iVar1 = *piVar7;
  if (ISAd[iVar1] < v) goto LAB_00105fe6;
  if (ISAd[iVar1] == v) {
    *piVar7 = *piVar3;
    *piVar3 = iVar1;
    piVar3 = piVar3 + -1;
  }
  goto LAB_00105fd4;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}